

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O3

void Io_MvSplitIntoTokensAndClear(Vec_Ptr_t *vTokens,char *pLine,char Stop,char Char)

{
  byte bVar1;
  byte *pOutput;
  char *pCur;
  
  pOutput = (byte *)pLine;
  do {
    bVar1 = *pOutput;
    if (bVar1 < 0xd) {
      if (bVar1 != 9) {
        if (bVar1 == 0) {
          Io_MvCollectTokens(vTokens,pLine,(char *)pOutput);
          return;
        }
        goto LAB_008a03bb;
      }
LAB_008a03cc:
      *pOutput = 0;
    }
    else {
      if ((bVar1 == 0xd) || (bVar1 == 0x20)) goto LAB_008a03cc;
LAB_008a03bb:
      if (bVar1 == 10 || bVar1 == Stop) goto LAB_008a03cc;
    }
    pOutput = pOutput + 1;
  } while( true );
}

Assistant:

static void Io_MvSplitIntoTokensAndClear( Vec_Ptr_t * vTokens, char * pLine, char Stop, char Char )
{
    char * pCur;
    // clear spaces
    for ( pCur = pLine; *pCur != Stop; pCur++ )
        if ( Io_MvCharIsSpace(*pCur) || *pCur == Char )
            *pCur = 0;
    // collect tokens
    Io_MvCollectTokens( vTokens, pLine, pCur );
}